

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGenerator::CheckCMP0037(cmGlobalGenerator *this,string *targetName,string *reason)

{
  cmTarget *tgt_00;
  cmake *cm;
  cmTarget *tgt;
  string *reason_local;
  string *targetName_local;
  cmGlobalGenerator *this_local;
  
  tgt_00 = FindTarget(this,targetName,false);
  if (tgt_00 == (cmTarget *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    cm = GetCMakeInstance(this);
    this_local._7_1_ = RaiseCMP0037Message(cm,tgt_00,reason);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::CheckCMP0037(std::string const& targetName,
                                     std::string const& reason) const
{
  cmTarget* tgt = this->FindTarget(targetName);
  if (!tgt) {
    return true;
  }
  return RaiseCMP0037Message(this->GetCMakeInstance(), tgt, reason);
}